

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

int t2_decode_packets(opj_t2_t *t2,uchar *src,int len,int tileno,opj_tcd_tile_t *tile,
                     opj_codestream_info_t *cstr_info)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  opj_image_t *image;
  opj_cp_t *cp;
  opj_tcp_t *poVar4;
  opj_cp_t *poVar5;
  opj_tcd_resolution_t *poVar6;
  opj_tcd_precinct_t *poVar7;
  opj_tcd_cblk_enc_t *poVar8;
  opj_tile_info_t *poVar9;
  opj_tp_info_t *poVar10;
  bool bVar11;
  int iVar12;
  opj_bool oVar13;
  uint uVar14;
  int iVar15;
  OPJ_UINT32 OVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  opj_pi_iterator_t *pi;
  opj_bio_t *bio;
  ulong uVar21;
  opj_tcd_seg_t *poVar22;
  uchar **ppuVar23;
  uchar *puVar24;
  opj_image_comp_t *poVar25;
  long lVar26;
  long lVar27;
  opj_packet_info_t *poVar28;
  int iVar29;
  opj_tcd_layer_t *poVar30;
  opj_tcd_cblk_dec_t *cblk;
  opj_pi_iterator_t *pi_00;
  int i;
  int iVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  uchar *puVar35;
  int local_10c;
  opj_packet_info_t *local_e8;
  
  image = t2->image;
  cp = t2->cp;
  pi = pi_create_decode(image,cp,tileno);
  iVar29 = -999;
  if (pi != (opj_pi_iterator_t *)0x0) {
    iVar29 = (int)src;
    if (cp->tcps[tileno].numpocs < 0) {
      lVar26 = 0;
      local_10c = 0;
    }
    else {
      local_10c = 0;
      iVar34 = 0;
      lVar26 = 0;
      do {
        pi_00 = pi + lVar26;
        while (oVar13 = pi_next(pi_00), oVar13 != 0) {
          if ((cp->layer == 0) || (iVar31 = 0, pi_00->layno < cp->layer)) {
            if (cstr_info == (opj_codestream_info_t *)0x0) {
              local_e8 = (opj_packet_info_t *)0x0;
            }
            else {
              local_e8 = cstr_info->tile[tileno].packet + cstr_info->packno;
            }
            poVar4 = cp->tcps;
            poVar5 = t2->cp;
            iVar19 = pi_00->compno;
            iVar2 = pi_00->resno;
            iVar3 = pi_00->precno;
            iVar20 = pi_00->layno;
            poVar6 = tile->comps[iVar19].resolutions;
            if ((iVar20 == 0) && (0 < poVar6[iVar2].numbands)) {
              lVar33 = 0;
              do {
                if ((poVar6[iVar2].bands[lVar33].x1 != poVar6[iVar2].bands[lVar33].x0) &&
                   (poVar6[iVar2].bands[lVar33].y1 != poVar6[iVar2].bands[lVar33].y0)) {
                  poVar7 = poVar6[iVar2].bands[lVar33].precincts;
                  tgt_reset(poVar7[iVar3].incltree);
                  tgt_reset(poVar7[iVar3].imsbtree);
                  uVar14 = poVar7[iVar3].ch * poVar7[iVar3].cw;
                  if (0 < (int)uVar14) {
                    lVar27 = 0;
                    do {
                      *(undefined4 *)((long)&(poVar7[iVar3].cblks.enc)->numpasses + lVar27) = 0;
                      lVar27 = lVar27 + 0x38;
                    } while ((ulong)uVar14 * 0x38 - lVar27 != 0);
                  }
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < poVar6[iVar2].numbands);
            }
            puVar24 = src;
            if ((poVar4[tileno].csty & 2) != 0) {
              if ((*src == 0xff) && (src[1] == 0x91)) {
                puVar24 = src + 6;
              }
              else {
                opj_event_msg(t2->cinfo,2,"Expected SOP marker\n");
              }
            }
            iVar31 = (int)src;
            iVar12 = (len + iVar29) - iVar31;
            bio = bio_create();
            if (poVar5->ppm == 1) {
              iVar15 = poVar5->ppm_len;
              puVar35 = poVar5->ppm_data;
            }
            else if (poVar4[tileno].ppt == 1) {
              iVar15 = poVar4[tileno].ppt_len;
              puVar35 = poVar4[tileno].ppt_data;
            }
            else {
              iVar15 = (iVar31 + iVar12) - (int)puVar24;
              puVar35 = puVar24;
            }
            bio_init_dec(bio,puVar35,iVar15);
            iVar15 = bio_read(bio,1);
            if (iVar15 == 0) {
              bio_inalign(bio);
              iVar19 = bio_numbytes(bio);
              puVar35 = puVar35 + iVar19;
              bio_destroy(bio);
              if ((poVar4[tileno].csty & 4) != 0) {
                if ((*puVar35 == 0xff) && (puVar35[1] == 0x92)) {
                  puVar35 = puVar35 + 2;
                }
                else {
                  puts("Error : expected EPH marker");
                }
              }
              if (local_e8 != (opj_packet_info_t *)0x0) {
                local_e8->end_ph_pos = (long)((int)puVar24 - iVar31);
              }
              if (poVar5->ppm == 1) {
                ppuVar23 = &poVar5->ppm_data;
                poVar5->ppm_len = poVar5->ppm_len + (*(int *)&poVar5->ppm_data - (int)puVar35);
LAB_0020b096:
                *ppuVar23 = puVar35;
                puVar35 = puVar24;
              }
              else if (poVar4[tileno].ppt == 1) {
                ppuVar23 = &poVar4[tileno].ppt_data;
                poVar4[tileno].ppt_len =
                     poVar4[tileno].ppt_len + (*(int *)&poVar4[tileno].ppt_data - (int)puVar35);
                goto LAB_0020b096;
              }
            }
            else {
              iVar15 = poVar6[iVar2].numbands;
              if (0 < iVar15) {
                lVar33 = 0;
                do {
                  if (((poVar6[iVar2].bands[lVar33].x1 != poVar6[iVar2].bands[lVar33].x0) &&
                      (poVar6[iVar2].bands[lVar33].y1 != poVar6[iVar2].bands[lVar33].y0)) &&
                     (poVar7 = poVar6[iVar2].bands[lVar33].precincts,
                     0 < poVar7[iVar3].ch * poVar7[iVar3].cw)) {
                    lVar27 = 0;
                    do {
                      poVar8 = poVar7[iVar3].cblks.enc;
                      if ((&poVar8->numpasses)[lVar27 * 0xe] == 0) {
                        OVar16 = tgt_decode(bio,poVar7[iVar3].incltree,(OPJ_UINT32)lVar27,iVar20 + 1
                                           );
                      }
                      else {
                        OVar16 = bio_read(bio,1);
                      }
                      cblk = (opj_tcd_cblk_dec_t *)(&poVar8->data + lVar27 * 7);
                      if (OVar16 == 0) {
                        cblk->numnewpasses = 0;
                      }
                      else {
                        if (cblk->numsegs == 0) {
                          iVar15 = 0;
                          do {
                            OVar16 = tgt_decode(bio,poVar7[iVar3].imsbtree,(OPJ_UINT32)lVar27,iVar15
                                               );
                            iVar15 = iVar15 + 1;
                          } while (OVar16 == 0);
                          cblk->numbps = (poVar6[iVar2].bands[lVar33].numbps - iVar15) + 2;
                          cblk->numlenbits = 3;
                        }
                        iVar15 = t2_getnumpasses(bio);
                        cblk->numnewpasses = iVar15;
                        iVar15 = -1;
                        do {
                          iVar17 = bio_read(bio,1);
                          iVar15 = iVar15 + 1;
                        } while (iVar17 != 0);
                        cblk->numlenbits = cblk->numlenbits + iVar15;
                        uVar14 = cblk->numsegs;
                        if ((long)(int)uVar14 == 0) {
                          uVar14 = poVar4[tileno].tccps[iVar19].cblksty;
                          poVar22 = (opj_tcd_seg_t *)realloc(cblk->segs,0x28);
                          cblk->segs = poVar22;
                          poVar22->len = 0;
                          OVar16 = 10;
                          if ((uVar14 & 1) == 0) {
                            OVar16 = 0x6d;
                          }
                          poVar22->data = (OPJ_BYTE **)0x0;
                          poVar22->dataindex = 0;
                          poVar22->numpasses = 0;
                          if ((uVar14 & 4) != 0) {
                            OVar16 = 1;
                          }
                          poVar22->maxpasses = OVar16;
                          uVar21 = 0;
                        }
                        else {
                          uVar21 = (long)(int)uVar14 - 1;
                          if (cblk->segs[uVar21].numpasses == cblk->segs[uVar21].maxpasses) {
                            t2_init_seg(cblk,uVar14,poVar4[tileno].tccps[iVar19].cblksty,0);
                            uVar21 = (ulong)uVar14;
                          }
                        }
                        uVar14 = cblk->numnewpasses;
                        lVar32 = (long)(int)uVar21;
                        while( true ) {
                          poVar22 = cblk->segs;
                          uVar18 = poVar22[lVar32].maxpasses - poVar22[lVar32].numpasses;
                          if ((int)uVar14 <= (int)uVar18) {
                            uVar18 = uVar14;
                          }
                          poVar22[lVar32].numnewpasses = uVar18;
                          iVar15 = 0;
                          if (1 < (int)uVar18) {
                            iVar15 = 0;
                            uVar21 = (ulong)uVar18;
                            do {
                              iVar15 = iVar15 + 1;
                              uVar18 = (uint)uVar21;
                              uVar21 = uVar21 >> 1;
                            } while (3 < uVar18);
                          }
                          OVar16 = bio_read(bio,iVar15 + cblk->numlenbits);
                          poVar22 = cblk->segs;
                          poVar22[lVar32].newlen = OVar16;
                          uVar14 = uVar14 - poVar22[lVar32].numnewpasses;
                          if ((int)uVar14 < 1) break;
                          lVar32 = lVar32 + 1;
                          t2_init_seg(cblk,(int)lVar32,poVar4[tileno].tccps[iVar19].cblksty,0);
                        }
                      }
                      lVar27 = lVar27 + 1;
                    } while (lVar27 < (long)poVar7[iVar3].ch * (long)poVar7[iVar3].cw);
                    iVar15 = poVar6[iVar2].numbands;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < iVar15);
              }
              iVar19 = bio_inalign(bio);
              if (iVar19 != 0) {
                bio_destroy(bio);
                return -999;
              }
              iVar19 = bio_numbytes(bio);
              puVar35 = puVar35 + iVar19;
              bio_destroy(bio);
              if ((poVar4[tileno].csty & 4) != 0) {
                if ((*puVar35 != 0xff) || (puVar35[1] != 0x92)) {
                  opj_event_msg(t2->cinfo,1,"Expected EPH marker\n");
                  return -999;
                }
                puVar35 = puVar35 + 2;
              }
              iVar19 = (int)puVar35;
              if (local_e8 != (opj_packet_info_t *)0x0) {
                local_e8->end_ph_pos = (long)(iVar19 - iVar31);
              }
              if (poVar5->ppm == 1) {
                ppuVar23 = &poVar5->ppm_data;
                poVar5->ppm_len = poVar5->ppm_len + (*(int *)&poVar5->ppm_data - iVar19);
LAB_0020b028:
                *ppuVar23 = puVar35;
                puVar35 = puVar24;
              }
              else if (poVar4[tileno].ppt == 1) {
                ppuVar23 = &poVar4[tileno].ppt_data;
                poVar4[tileno].ppt_len =
                     poVar4[tileno].ppt_len + (*(int *)&poVar4[tileno].ppt_data - iVar19);
                goto LAB_0020b028;
              }
              iVar19 = poVar6[iVar2].numbands;
              if (0 < iVar19) {
                lVar33 = 0;
                do {
                  if ((poVar6[iVar2].bands[lVar33].x1 != poVar6[iVar2].bands[lVar33].x0) &&
                     (poVar6[iVar2].bands[lVar33].y1 != poVar6[iVar2].bands[lVar33].y0)) {
                    poVar7 = poVar6[iVar2].bands[lVar33].precincts;
                    iVar20 = poVar7[iVar3].cw;
                    iVar15 = poVar7[iVar3].ch;
                    if (0 < iVar15 * iVar20) {
                      lVar27 = 0;
                      do {
                        if ((&(poVar7[iVar3].cblks.enc)->numlenbits)[lVar27 * 0xe] != 0) {
                          ppuVar23 = &(poVar7[iVar3].cblks.enc)->data + lVar27 * 7;
                          lVar32 = (long)*(int *)(ppuVar23 + 6);
                          poVar30 = (opj_tcd_layer_t *)ppuVar23[1];
                          if (lVar32 == 0) {
                            *(int *)(ppuVar23 + 6) = 1;
                            *(int *)(ppuVar23 + 5) = 0;
                          }
                          else if (*(int *)((long)poVar30 + lVar32 * 0x28 + -0x1c) ==
                                   *(int *)((long)poVar30 + (lVar32 * 5 + -2) * 8)) {
                            poVar30 = (opj_tcd_layer_t *)((long)poVar30 + lVar32 * 0x28);
                            *(int *)(ppuVar23 + 6) = *(int *)(ppuVar23 + 6) + 1;
                          }
                          else {
                            poVar30 = (opj_tcd_layer_t *)((long)poVar30 + (lVar32 * 5 + -5) * 8);
                          }
                          uVar21 = (ulong)*(uint *)&poVar30[1].disto;
                          if (src + iVar12 < puVar35 + uVar21) {
                            return -999;
                          }
                          iVar19 = *(int *)(ppuVar23 + 5);
                          while( true ) {
                            puVar24 = (uchar *)realloc(*ppuVar23,(ulong)(uint)(iVar19 + (int)uVar21)
                                                      );
                            *ppuVar23 = puVar24;
                            memcpy(puVar24 + *(int *)(ppuVar23 + 5),puVar35,
                                   (ulong)*(uint *)&poVar30[1].disto);
                            iVar20 = *(int *)((long)&poVar30->disto + 4);
                            iVar19 = *(int *)(ppuVar23 + 5);
                            if (iVar20 == 0) {
                              *(uchar ***)poVar30 = ppuVar23;
                              *(int *)&poVar30->disto = iVar19;
                            }
                            uVar14 = *(uint *)&poVar30[1].disto;
                            iVar19 = iVar19 + uVar14;
                            *(int *)(ppuVar23 + 5) = iVar19;
                            piVar1 = (int *)((long)&poVar30->data + 4);
                            *piVar1 = *piVar1 + uVar14;
                            puVar35 = puVar35 + uVar14;
                            *(OPJ_UINT32 *)((long)&poVar30->disto + 4) = iVar20 + poVar30[1].len;
                            iVar20 = *(int *)((long)ppuVar23 + 0x2c) - poVar30[1].len;
                            *(int *)((long)ppuVar23 + 0x2c) = iVar20;
                            if (iVar20 < 1) break;
                            *(int *)(ppuVar23 + 6) = *(int *)(ppuVar23 + 6) + 1;
                            uVar21 = (ulong)poVar30[3].numpasses;
                            poVar30 = (opj_tcd_layer_t *)&poVar30[1].data;
                            if (src + iVar12 < puVar35 + uVar21) {
                              return -999;
                            }
                          }
                          iVar20 = poVar7[iVar3].cw;
                          iVar15 = poVar7[iVar3].ch;
                        }
                        lVar27 = lVar27 + 1;
                      } while (lVar27 < iVar20 * iVar15);
                      iVar19 = poVar6[iVar2].numbands;
                    }
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < iVar19);
              }
            }
            iVar31 = (int)puVar35 - iVar31;
            if (iVar31 == -999) {
              return -999;
            }
            if (iVar31 < 1) goto LAB_0020b29a;
            poVar25 = image->comps;
            lVar33 = (long)pi_00->compno;
            OVar16 = poVar25[lVar33].resno_decoded;
            if ((int)poVar25[lVar33].resno_decoded < pi_00->resno) {
              OVar16 = pi_00->resno;
            }
          }
          else {
LAB_0020b29a:
            poVar25 = image->comps;
            lVar33 = (long)pi_00->compno;
            OVar16 = poVar25[lVar33].resno_decoded;
          }
          poVar25[lVar33].resno_decoded = OVar16;
          if (cstr_info != (opj_codestream_info_t *)0x0) {
            poVar9 = cstr_info->tile;
            iVar19 = cstr_info->packno;
            poVar28 = poVar9[tileno].packet + iVar19;
            if ((long)iVar19 == 0) {
              lVar33 = (long)poVar9[tileno].end_header + 1;
            }
            else {
              poVar10 = poVar9[tileno].tp;
              if (poVar28[-1].end_pos < (long)poVar10[iVar34].tp_end_pos) {
                if ((cp->tp_on == '\0') || (lVar33 = poVar28->start_pos, lVar33 == 0)) {
                  lVar33 = poVar28[-1].end_pos + 1;
                }
              }
              else {
                poVar10[iVar34].tp_numpacks = iVar19 - local_10c;
                poVar10[iVar34].tp_start_pack = local_10c;
                iVar34 = iVar34 + 1;
                lVar33 = (long)poVar10[iVar34].tp_end_header + 1;
                local_10c = iVar19;
              }
            }
            poVar28->start_pos = lVar33;
            poVar28->end_pos = lVar33 + iVar31 + -1;
            poVar28->end_ph_pos = poVar28->end_ph_pos + lVar33 + -1;
            cstr_info->packno = iVar19 + 1;
          }
          src = src + iVar31;
        }
        bVar11 = lVar26 < cp->tcps[tileno].numpocs;
        lVar26 = lVar26 + 1;
      } while (bVar11);
      lVar26 = (long)iVar34;
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      poVar10 = cstr_info->tile[tileno].tp;
      poVar10[lVar26].tp_numpacks = cstr_info->packno - local_10c;
      poVar10[lVar26].tp_start_pack = local_10c;
    }
    pi_destroy(pi,cp,tileno);
    iVar29 = (int)src - iVar29;
  }
  return iVar29;
}

Assistant:

int t2_decode_packets(opj_t2_t *t2, unsigned char *src, int len, int tileno, opj_tcd_tile_t *tile, opj_codestream_info_t *cstr_info) {
	unsigned char *c = src;
	opj_pi_iterator_t *pi;
	int pino, e = 0;
	int n = 0, curtp = 0;
	int tp_start_packno;

	opj_image_t *image = t2->image;
	opj_cp_t *cp = t2->cp;
	
	/* create a packet iterator */
	pi = pi_create_decode(image, cp, tileno);
	if(!pi) {
		/* TODO: throw an error */
		return -999;
	}

	tp_start_packno = 0;
	
	for (pino = 0; pino <= cp->tcps[tileno].numpocs; pino++) {
		while (pi_next(&pi[pino])) {
			if ((cp->layer==0) || (cp->layer>=((pi[pino].layno)+1))) {
				opj_packet_info_t *pack_info;
				if (cstr_info)
					pack_info = &cstr_info->tile[tileno].packet[cstr_info->packno];
				else
					pack_info = NULL;
				e = t2_decode_packet(t2, c, src + len - c, tile, &cp->tcps[tileno], &pi[pino], pack_info);
			} else {
				e = 0;
			}
			if(e == -999) return -999;
			/* progression in resolution */
			image->comps[pi[pino].compno].resno_decoded =	
				(e > 0) ? 
				int_max(pi[pino].resno, image->comps[pi[pino].compno].resno_decoded) 
				: image->comps[pi[pino].compno].resno_decoded;
			n++;

			/* INDEX >> */
			if(cstr_info) {
				opj_tile_info_t *info_TL = &cstr_info->tile[tileno];
				opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
				if (!cstr_info->packno) {
					info_PK->start_pos = info_TL->end_header + 1;
				} else if (info_TL->packet[cstr_info->packno-1].end_pos >= (int)cstr_info->tile[tileno].tp[curtp].tp_end_pos){ /* New tile part*/
					info_TL->tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in previous tile-part*/
          info_TL->tp[curtp].tp_start_pack = tp_start_packno;
					tp_start_packno = cstr_info->packno;
					curtp++;
					info_PK->start_pos = cstr_info->tile[tileno].tp[curtp].tp_end_header+1;
				} else {
					info_PK->start_pos = (cp->tp_on && info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
				}
				info_PK->end_pos = info_PK->start_pos + e - 1;
				info_PK->end_ph_pos += info_PK->start_pos - 1;	/* End of packet header which now only represents the distance 
																												// to start of packet is incremented by value of start of packet*/
				cstr_info->packno++;
			}
			/* << INDEX */
			
			if (e == -999) {		/* ADD */
				break;
			} else {
				c += e;
			}			
		}
	}
	/* INDEX >> */
	if(cstr_info) {
		cstr_info->tile[tileno].tp[curtp].tp_numpacks = cstr_info->packno - tp_start_packno; /* Number of packets in last tile-part*/
    cstr_info->tile[tileno].tp[curtp].tp_start_pack = tp_start_packno;
	}
	/* << INDEX */

	/* don't forget to release pi */
	pi_destroy(pi, cp, tileno);
	
	if (e == -999) {
		return e;
	}
	
	return (c - src);
}